

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O0

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>::insert
          (HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
           *this,pair<unsigned_long,_long> *value)

{
  bool bVar1;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *pSVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *pSVar6;
  NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *pNVar7;
  long in_RDI;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *thatRefs;
  size_t level;
  Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *pNode;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *in_stack_ffffffffffffff68;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *in_stack_ffffffffffffff70;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *pSVar8;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *in_stack_ffffffffffffff80;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *in_stack_ffffffffffffff88;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *in_stack_ffffffffffffff90;
  _Pool *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *in_stack_ffffffffffffffb0;
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *pSVar9;
  Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *this_00;
  
  this_00 = (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
             *)0x0;
  pSVar2 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
            *)SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              ::height((SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                        *)0xa22489);
  _throwIfValueDoesNotCompare
            (in_stack_ffffffffffffffb0,
             (pair<unsigned_long,_long> *)
             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  do {
    pSVar9 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              *)((long)&pSVar2[-1]._swapLevel + 7);
    if (pSVar2 == (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                   *)0x0) break;
    SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
    ::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    this_00 = Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              ::insert(this_00,(pair<unsigned_long,_long> *)pSVar9);
    pSVar2 = pSVar9;
  } while (this_00 ==
           (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
            *)0x0);
  if (this_00 ==
      (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *)
      0x0) {
    this_00 = Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              ::_Pool::Allocate(in_stack_ffffffffffffff98,
                                (pair<unsigned_long,_long> *)in_stack_ffffffffffffff90);
    pSVar9 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              *)0x0;
  }
  pSVar2 = Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
           ::nodeRefs(this_00);
  bVar1 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
          ::canSwap(in_stack_ffffffffffffff70);
  if (bVar1) {
    while( true ) {
      sVar3 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              ::height((SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                        *)0xa22558);
      sVar4 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              ::height((SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                        *)0xa22567);
      if (sVar4 <= sVar3) break;
      SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
      ::push_back(in_stack_ffffffffffffff80,
                  (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                  (size_t)in_stack_ffffffffffffff70);
    }
    pSVar8 = pSVar9;
    pSVar6 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              *)SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                ::swapLevel(pSVar2);
    if (pSVar9 < pSVar6) {
      pNVar7 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
               ::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      sVar3 = pNVar7->width;
      SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
      ::swapLevel(pSVar2);
      pNVar7 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
               ::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      pNVar7->width = sVar3 + pNVar7->width;
      pSVar8 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                *)((long)&(pSVar8->_nodes).
                          super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    while( true ) {
      pSVar9 = pSVar8;
      pSVar6 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                *)SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                  ::height((SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                            *)0xa22626);
      bVar1 = false;
      if (pSVar8 < pSVar6) {
        bVar1 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                ::canSwap(in_stack_ffffffffffffff70);
      }
      if (bVar1 == false) break;
      pNVar7 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
               ::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      lVar5 = pNVar7->width - 1;
      pNVar7 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
               ::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      pNVar7->width = pNVar7->width - lVar5;
      SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
      ::swap(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      bVar1 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              ::canSwap(in_stack_ffffffffffffff70);
      if (bVar1) {
        pNVar7 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                 ::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff90 =
             (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              *)pNVar7->width;
        in_stack_ffffffffffffff88 = pSVar2;
        SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
        ::swapLevel(pSVar2);
        pNVar7 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                 ::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
        pNVar7->width = (size_t)in_stack_ffffffffffffff90;
      }
      pSVar8 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                *)((long)&(pSVar9->_nodes).
                          super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  pSVar8 = pSVar9;
  pSVar2 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
            *)SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              ::swapLevel(pSVar2);
  if (pSVar9 < pSVar2) {
    pSVar8 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              *)((long)&(pSVar8->_nodes).
                        super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  while( true ) {
    pSVar2 = pSVar8;
    pSVar6 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              *)SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                ::height((SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                          *)0xa2275a);
    bVar1 = false;
    pSVar9 = pSVar2;
    if (pSVar8 < pSVar6) {
      pSVar6 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                *)SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                  ::height((SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                            *)0xa22780);
      bVar1 = pSVar6 <= pSVar2;
      in_stack_ffffffffffffff68 = pSVar2;
    }
    if (!bVar1) break;
    pSVar2 = (SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              *)((long)&(pSVar9->_nodes).
                        super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
    pNVar7 = SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
             ::operator[](pSVar8,(size_t)in_stack_ffffffffffffff68);
    pNVar7->width = pNVar7->width + 1;
    pSVar8 = pSVar2;
  }
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
  return;
}

Assistant:

void HeadNode<T, _Compare>::insert(const T &value) {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode insert() thread: " << std::this_thread::get_id() << std::endl;
#endif
#endif
    Node<T, _Compare> *pNode = nullptr;
    size_t level = _nodeRefs.height();

    _throwIfValueDoesNotCompare(value);
    while (level-- > 0) {
        assert(_nodeRefs[level].pNode);
        pNode = _nodeRefs[level].pNode->insert(value);
        if (pNode) {
            break;
        }
    }
    if (! pNode) {
        pNode = _pool.Allocate(value);
        level = 0;
    }
    assert(pNode);
    SwappableNodeRefStack<T, _Compare> &thatRefs = pNode->nodeRefs();
    if (thatRefs.canSwap()) {
        // Expand this to that
        while (_nodeRefs.height() < thatRefs.height()) {
            _nodeRefs.push_back(nullptr, _count + 1);
        }
        if (level < thatRefs.swapLevel()) {
            // Happens when we were originally, say 3 high (max height of any
            // previously seen node). Then a node is created
            // say 5 high. In that case this will be at level 2 and
            // thatRefs.swapLevel() will be 3
            assert(level + 1 == thatRefs.swapLevel());
            thatRefs[thatRefs.swapLevel()].width += _nodeRefs[level].width;
            ++level;
        }
        // Now swap
        while (level < _nodeRefs.height() && thatRefs.canSwap()) {
            assert(thatRefs.canSwap());
            assert(level == thatRefs.swapLevel());
            _nodeRefs[level].width -= thatRefs[level].width - 1;
            thatRefs.swap(_nodeRefs);
            if (thatRefs.canSwap()) {
                assert(thatRefs[thatRefs.swapLevel()].width == 0);
                thatRefs[thatRefs.swapLevel()].width = _nodeRefs[level].width;
            }
            ++level;
        }
        // Check all references swapped
        assert(! thatRefs.canSwap());
        // Check that all 'this' pointers created on construction have been moved
        assert(thatRefs.noNodePointerMatches(pNode));
    }
    if (level < thatRefs.swapLevel()) {
        // Happens when we are, say 5 high then a node is created
        // and consumed by the next node say 3 high. In that case this will be
        // at level 2 and thatRefs.swapLevel() will be 3
        assert(level + 1 == thatRefs.swapLevel());
        ++level;
    }
    // Increment my widths as my references are now going over the top of
    // pNode.
    while (level < _nodeRefs.height() && level >= thatRefs.height()) {
        _nodeRefs[level++].width += 1;
    }
    ++_count;
#ifdef SKIPLIST_THREAD_SUPPORT
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode insert() thread: " << std::this_thread::get_id() << " DONE" << std::endl;
#endif
#endif
}